

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

double nonius::detail::outlier_variance(estimate<double> mean,estimate<double> stddev,int n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  anon_class_32_4_9b8c116d local_28;
  
  dVar4 = (double)n;
  dVar2 = 1.0 / dVar4;
  local_28.mn = mean.point * dVar2;
  dVar3 = local_28.mn * 0.5;
  dVar6 = stddev.point / SQRT(dVar4);
  if (local_28.mn * 0.125 <= stddev.point / SQRT(dVar4)) {
    dVar6 = local_28.mn * 0.125;
  }
  dVar5 = stddev.point * stddev.point;
  dVar6 = dVar6 * dVar6;
  local_28.n = n;
  local_28.sb2 = dVar5;
  local_28.sg2 = dVar6;
  dVar1 = outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_28,0.0);
  dVar3 = outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_28,dVar3);
  if (dVar1 <= dVar3) {
    dVar3 = dVar1;
  }
  dVar3 = dVar2 * (dVar4 - dVar3) * (dVar5 - dVar6 * (dVar4 - dVar3));
  dVar6 = dVar2 * (dVar4 + -1.0) * (dVar5 - dVar6 * (dVar4 + -1.0));
  if (dVar3 <= dVar6) {
    dVar6 = dVar3;
  }
  return dVar6 / dVar5;
}

Assistant:

inline double outlier_variance(estimate<double> mean, estimate<double> stddev, int n) {
            double sb = stddev.point;
            double mn = mean.point / n;
            double mg_min = mn / 2.;
            double sg = std::min(mg_min / 4., sb / std::sqrt(n));
            double sg2 = sg * sg;
            double sb2 = sb * sb;

            auto c_max = [n, mn, sb2, sg2](double x) -> double {
                double k = mn - x;
                double d = k * k;
                double nd = n * d;
                double k0 = -n * nd;
                double k1 = sb2 - n * sg2 + nd;
                double det = k1 * k1 - 4 * sg2 * k0;
                return (int)(-2. * k0 / (k1 + std::sqrt(det)));
            };

            auto var_out = [n, sb2, sg2](double c) {
                double nc = n - c;
                return (nc / n) * (sb2 - nc * sg2);
            };

            return std::min(var_out(1), var_out(std::min(c_max(0.), c_max(mg_min)))) / sb2;
        }